

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall
OpenMD::VectorAccumulator::get95percentConfidenceInterval(VectorAccumulator *this,ResultType *ret)

{
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ResultType sd;
  Vector<double,_3U> local_38;
  
  Vector<double,_3U>::Vector(&local_38);
  getStdDev(this,(ResultType *)&local_38);
  sVar1 = (this->super_BaseAccumulator).Count_;
  dVar2 = SQRT(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  auVar3._0_8_ = local_38.data_[0] * 1.96;
  auVar3._8_8_ = local_38.data_[1] * 1.96;
  auVar4._8_8_ = dVar2;
  auVar4._0_8_ = dVar2;
  auVar4 = divpd(auVar3,auVar4);
  *(undefined1 (*) [16])(ret->super_Vector<double,_3U>).data_ = auVar4;
  (ret->super_Vector<double,_3U>).data_[2] = (local_38.data_[2] * 1.96) / dVar2;
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      ResultType sd;
      this->getStdDev(sd);
      ret[0] = 1.960 * sd[0] / sqrt(RealType(Count_));
      ret[1] = 1.960 * sd[1] / sqrt(RealType(Count_));
      ret[2] = 1.960 * sd[2] / sqrt(RealType(Count_));
      return;
    }